

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

_Bool CrawlIdentifierCharacters(Lexer *lexer)

{
  int iVar1;
  char character;
  ushort **ppuVar2;
  ushort *puVar3;
  char cVar4;
  _Bool _Var5;
  bool bVar6;
  
  iVar1 = (lexer->tracker).currentTokenPosition;
  cVar4 = -1;
  if (iVar1 < lexer->length) {
    cVar4 = lexer->rawSourceCode[iVar1];
  }
  character = PeekNextCharacter(lexer);
  ppuVar2 = __ctype_b_loc();
  puVar3 = *ppuVar2;
  _Var5 = (_Bool)(cVar4 == '_' | (*(byte *)((long)puVar3 + (long)cVar4 * 2 + 1) & 4) >> 2);
  if (_Var5 != true) {
    return _Var5;
  }
  (lexer->tracker).tokenStart = (lexer->tracker).currentTokenPosition;
  bVar6 = false;
  while (((puVar3[character] & 8) != 0 || (_Var5 = IsCharacter(character,"$_"), _Var5))) {
    character = PeekNextCharacter(lexer);
    GetNextCharacter(lexer);
    puVar3 = *ppuVar2;
    bVar6 = true;
  }
  if (!bVar6) {
    GetNextCharacter(lexer);
  }
  (lexer->tracker).tokenEnd = (lexer->tracker).currentTokenPosition;
  return true;
}

Assistant:

bool CrawlIdentifierCharacters(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	char nextChar = PeekNextCharacter(lexer);
	if (isalpha(currentChar) || currentChar == '_'){
		SetTokenStart(lexer);
		char* checkCharacters = "$_";
		bool inside = false;
		while (true){
			if (!isalnum(nextChar) && !IsCharacter(nextChar, checkCharacters)) break;
			nextChar = PeekNextCharacter(lexer);
			GetNextCharacter(lexer);
			inside = true;
		}
		if (!inside) GetNextCharacter(lexer);
		SetTokenEnd(lexer);
		return true;
	}
	return false;
}